

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,SpacingMode spacingMode)

{
  int count;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkRenderPass renderPass_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)17>_> data_02;
  RefData<vk::Handle<(vk::HandleType)23>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  RefData<vk::Handle<(vk::HandleType)18>_> data_07;
  pointer pfVar2;
  deUint32 queueFamilyIndex_00;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  const_iterator __first;
  const_iterator __last;
  reference pfVar3;
  DescriptorSetLayoutBuilder *pDVar4;
  DescriptorPoolBuilder *pDVar5;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)19> *pHVar7;
  VkBuffer *pVVar8;
  Handle<(vk::HandleType)22> *pHVar9;
  DescriptorSetUpdateBuilder *pDVar10;
  Handle<(vk::HandleType)17> *pHVar11;
  Handle<(vk::HandleType)24> *pHVar12;
  ProgramCollection<vk::ProgramBinary> *pPVar13;
  ProgramBinary *pPVar14;
  GraphicsPipelineBuilder *pGVar15;
  Handle<(vk::HandleType)16> *pHVar16;
  size_type sVar17;
  Allocation *pAVar18;
  value_type *pvVar19;
  const_reference pvVar20;
  VkDeviceMemory VVar21;
  VkDeviceSize VVar22;
  void *pvVar23;
  VkCommandBuffer_s **ppVVar24;
  Handle<(vk::HandleType)23> *pHVar25;
  Handle<(vk::HandleType)18> *pHVar26;
  TestContext *pTVar27;
  TestLog *pTVar28;
  int *piVar29;
  allocator<char> local_8f1;
  string local_8f0;
  byte local_8cb;
  byte local_8ca;
  allocator<char> local_8c9;
  string local_8c8;
  int local_8a4;
  int local_8a0;
  float local_89c;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  vector<float,_std::allocator<float>_> resultTessCoords;
  deInt32 numResults;
  Allocation *resultAlloc;
  TestLog *log;
  undefined1 local_858 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  Allocation *alloc_1;
  float *tessLevelOuter1;
  Allocation *alloc;
  deUint32 tessLevelCaseNdx;
  bool success;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  GraphicsPipelineBuilder local_718;
  Move<vk::Handle<(vk::HandleType)18>_> local_610;
  RefData<vk::Handle<(vk::HandleType)18>_> local_5f0;
  undefined1 local_5d0 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::VkCommandBuffer_s_*> local_5a8;
  RefData<vk::VkCommandBuffer_s_*> local_588;
  undefined1 local_568 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_528;
  undefined1 local_508 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_4e0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_4c0;
  undefined1 local_4a0 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_478;
  RefData<vk::Handle<(vk::HandleType)23>_> local_458;
  undefined1 local_438 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_3f8;
  undefined1 local_3d8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Location local_3a8;
  VkDescriptorSet local_3a0;
  DescriptorSetUpdateBuilder local_398;
  deUint64 local_350;
  undefined1 local_348 [8];
  VkDescriptorBufferInfo resultBufferInfo;
  undefined1 local_328 [8];
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_300;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2e0;
  undefined1 local_2c0 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_288;
  RefData<vk::Handle<(vk::HandleType)21>_> local_268;
  undefined1 local_248 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_1e0;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1c0;
  undefined1 local_1a0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_178;
  undefined1 local_140 [8];
  Buffer tessLevelsBuffer;
  VkDeviceSize tessLevelsBufferSizeBytes;
  VkBufferCreateInfo local_100;
  undefined1 local_c8 [8];
  Buffer resultBuffer;
  VkDeviceSize resultBufferSizeBytes;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_70;
  int local_64;
  undefined1 local_60 [4];
  int maxNumVertices;
  vector<float,_std::allocator<float>_> tessLevelCases;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SpacingMode spacingMode_local;
  Context *context_local;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex(context);
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Context::getDefaultAllocator(context);
  genTessLevelCases();
  __first = std::vector<float,_std::allocator<float>_>::begin
                      ((vector<float,_std::allocator<float>_> *)local_60);
  __last = std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)local_60);
  local_70 = std::
             max_element<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                       (__first._M_current,__last._M_current);
  pfVar3 = __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
           ::operator*(&local_70);
  local_64 = getClampedRoundedTessLevel(spacingMode,*pfVar3);
  pfVar2 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_64 = local_64 + 1;
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = (long)local_64 * 4 + 4;
  makeBufferCreateInfo
            (&local_100,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x20
            );
  tessellation::Buffer::Buffer
            ((Buffer *)local_c8,vk_00,device_00,(Allocator *)pfVar2,&local_100,
             ::vk::MemoryRequirement::HostVisible);
  pfVar2 = tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  tessLevelsBuffer.m_allocation.
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 4;
  makeBufferCreateInfo(&local_178,4,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_140,vk_00,device_00,(Allocator *)pfVar2,&local_178,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     ((DescriptorSetLayoutBuilder *)
                      &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                       m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar4,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build(&local_1e0,pDVar4,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c0,(Move *)&local_1e0);
  data.deleter.m_deviceIface._0_4_ = (int)local_1c0.deleter.m_deviceIface;
  data.object.m_internal = local_1c0.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_1c0.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_1c0.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_1c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1a0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_1e0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar5 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)
                      &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                       m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar5 = ::vk::DescriptorPoolBuilder::addType(pDVar5,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_288,pDVar5,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_268,(Move *)&local_288);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_268.deleter.m_deviceIface;
  data_00.object.m_internal = local_268.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_268.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_268.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_268.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_268.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_248,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_288);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_248);
  descriptorPool_00.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
  tessLevelsBufferInfo.range = pHVar7->m_internal;
  makeDescriptorSet(&local_300,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)tessLevelsBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2e0,(Move *)&local_300);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2e0.deleter.m_deviceIface;
  data_01.object.m_internal = local_2e0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2e0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_2e0.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_2e0.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_2e0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2c0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_300);
  pVVar8 = tessellation::Buffer::get((Buffer *)local_140);
  resultBufferInfo.range = pVVar8->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_328,(VkBuffer)resultBufferInfo.range,0,4);
  pVVar8 = tessellation::Buffer::get((Buffer *)local_c8);
  local_350 = pVVar8->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_348,(VkBuffer)local_350,0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_398);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2c0);
  local_3a0.m_internal = pHVar9->m_internal;
  local_3a8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar10 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_398,local_3a0,&local_3a8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_328);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2c0);
  destSet.m_internal = pHVar9->m_internal;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar10 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar10,destSet,
                       (Location *)
                       &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_348);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar10,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_398);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3f8,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3f8.deleter.m_deviceIface;
  data_02.object.m_internal = local_3f8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3f8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_3f8.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_3f8.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_3f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3d8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3d8);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar11->m_internal;
  makeFramebufferWithoutAttachments
            (&local_478,vk_00,device_00,
             (VkRenderPass)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
             m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_458,(Move *)&local_478);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_458.deleter.m_deviceIface;
  data_03.object.m_internal = local_458.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_458.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_458.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_458.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_458.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_438,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_478);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar7->m_internal;
  makePipelineLayout(&local_4e0,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4c0,(Move *)&local_4e0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_4c0.deleter.m_deviceIface;
  data_04.object.m_internal = local_4c0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4c0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_4c0.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_4c0.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_4c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_4a0,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_4e0);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_528,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_528.deleter.m_deviceIface;
  data_05.object.m_internal = local_528.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_528.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_528.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_528.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_528.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_508,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_508);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar12->m_internal;
  ::vk::allocateCommandBuffer
            (&local_5a8,vk_00,device_00,
             (VkCommandPool)
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_588,(Move *)&local_5a8);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_588.deleter.m_deviceIface;
  data_06.object = local_588.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_588.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_588.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_588.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_588.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_568,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_5a8);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_718);
  pPVar13 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"vert",&local_739);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar13,&local_738);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (&local_718,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar14,
                       (VkSpecializationInfo *)0x0);
  pPVar13 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"tesc",&local_761);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar13,&local_760);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar14,
                       (VkSpecializationInfo *)0x0);
  pPVar13 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"tese",&local_789);
  pPVar14 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar13,&local_788);
  pGVar15 = GraphicsPipelineBuilder::setShader
                      (pGVar15,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar14,
                       (VkSpecializationInfo *)0x0);
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_4a0);
  pipelineLayout_00.m_internal = pHVar16->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3d8);
  GraphicsPipelineBuilder::build
            (&local_610,pGVar15,vk_00,device_00,pipelineLayout_00,(VkRenderPass)pHVar11->m_internal)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5f0,(Move *)&local_610);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_5f0.deleter.m_deviceIface;
  data_07.object.m_internal = local_5f0.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5f0.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_5f0.deleter.m_device;
  data_07.deleter.m_allocator._0_4_ = (int)local_5f0.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_5f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5d0,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_610);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_718);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&tessLevelCaseNdx);
  alloc._7_1_ = false;
  for (alloc._0_4_ = 0;
      sVar17 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)local_60), (uint)alloc < sVar17;
      alloc._0_4_ = (uint)alloc + 1) {
    pAVar18 = tessellation::Buffer::getAllocation((Buffer *)local_140);
    pvVar19 = (value_type *)::vk::Allocation::getHostPtr(pAVar18);
    pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_60,(ulong)(uint)alloc);
    *pvVar19 = *pvVar20;
    VVar21 = ::vk::Allocation::getMemory(pAVar18);
    VVar22 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::flushMappedMemoryRange(vk_00,device_00,VVar21,VVar22,4);
    pAVar18 = tessellation::Buffer::getAllocation((Buffer *)local_c8);
    pvVar23 = ::vk::Allocation::getHostPtr(pAVar18);
    ::deMemset(pvVar23,0,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    VVar21 = ::vk::Allocation::getMemory(pAVar18);
    VVar22 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::flushMappedMemoryRange
              (vk_00,device_00,VVar21,VVar22,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    beginCommandBuffer(vk_00,*ppVVar24);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    commandBuffer = *ppVVar24;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3d8);
    renderPass_00.m_internal = pHVar11->m_internal;
    pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_438);
    beginRenderPassWithRasterizationDisabled
              (vk_00,commandBuffer,renderPass_00,(VkFramebuffer)pHVar25->m_internal);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    pVVar1 = *ppVVar24;
    pHVar26 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5d0);
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,pHVar26->m_internal);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    pVVar1 = *ppVVar24;
    pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_4a0);
    shaderWriteBarrier.size = pHVar16->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                       ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2c0);
    (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,0,shaderWriteBarrier.size,0,1,pHVar9,0,0);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar24,1,1,0);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    endRenderPass(vk_00,*ppVVar24);
    pVVar8 = tessellation::Buffer::operator*((Buffer *)local_c8);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_858,0x40,0x2000,(VkBuffer)pVVar8->m_internal,0,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar24,0x8000,0x4000,0,0,0,1,local_858,0,0);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    endCommandBuffer(vk_00,*ppVVar24);
    ppVVar24 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_568);
    submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar24);
    pTVar27 = Context::getTestContext(context);
    pTVar28 = tcu::TestContext::getLog(pTVar27);
    pAVar18 = tessellation::Buffer::getAllocation((Buffer *)local_c8);
    VVar21 = ::vk::Allocation::getMemory(pAVar18);
    VVar22 = ::vk::Allocation::getOffset(pAVar18);
    ::vk::invalidateMappedMemoryRange
              (vk_00,device_00,VVar21,VVar22,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    piVar29 = (int *)::vk::Allocation::getHostPtr(pAVar18);
    count = *piVar29;
    resultTessCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = count;
    pvVar23 = ::vk::Allocation::getHostPtr(pAVar18);
    readFloatArray((vector<float,_std::allocator<float>_> *)&additionalSegmentLocation,count,pvVar23
                   ,4);
    pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_60,(ulong)(uint)alloc);
    alloc._7_1_ = verifyFractionalSpacingSingle
                            (pTVar28,spacingMode,*pvVar20,
                             (vector<float,_std::allocator<float>_> *)&additionalSegmentLocation,
                             &local_89c,&local_8a0);
    if (alloc._7_1_) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_89c);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&tessLevelCaseNdx,&local_8a0);
      local_8a4 = 0;
    }
    else {
      local_8a4 = 2;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&additionalSegmentLocation);
    if (local_8a4 != 0) break;
  }
  if (alloc._7_1_ != false) {
    pTVar27 = Context::getTestContext(context);
    pTVar28 = tcu::TestContext::getLog(pTVar27);
    alloc._7_1_ = verifyFractionalSpacingMultiple
                            (pTVar28,spacingMode,(vector<float,_std::allocator<float>_> *)local_60,
                             (vector<float,_std::allocator<float>_> *)
                             &additionalSegmentLocations.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (vector<int,_std::allocator<int>_> *)&tessLevelCaseNdx);
  }
  local_8ca = 0;
  local_8cb = 0;
  if (alloc._7_1_ == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f0,"Failure",&local_8f1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_8f0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator(&local_8f1);
  }
  else {
    std::allocator<char>::allocator();
    local_8ca = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"OK",&local_8c9);
    local_8cb = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_8c8);
  }
  if ((local_8cb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_8c8);
  }
  if ((local_8ca & 1) != 0) {
    std::allocator<char>::~allocator(&local_8c9);
  }
  local_8a4 = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&tessLevelCaseNdx);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5d0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_568);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_508);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_4a0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_438);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2c0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_248);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1a0);
  tessellation::Buffer::~Buffer((Buffer *)local_140);
  tessellation::Buffer::~Buffer((Buffer *)local_c8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const SpacingMode spacingMode)
{
	DE_ASSERT(spacingMode == SPACINGMODE_FRACTIONAL_ODD || spacingMode == SPACINGMODE_FRACTIONAL_EVEN);

	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	tessLevelCases = genTessLevelCases();
	const int					maxNumVertices = 1 + getClampedRoundedTessLevel(spacingMode, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));

	// Result buffer: generated tess coords go here.

	const VkDeviceSize resultBufferSizeBytes = sizeof(int) + sizeof(float) * maxNumVertices;
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Outer1 tessellation level constant buffer.

	const VkDeviceSize tessLevelsBufferSizeBytes = sizeof(float);  // we pass only outer1
	const Buffer	   tessLevelsBuffer			 (vk, device, allocator, makeBufferCreateInfo(tessLevelsBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet			(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo	= makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, tessLevelsBufferSizeBytes);
	const VkDescriptorBufferInfo  resultBufferInfo		= makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkRenderPass>		renderPass	  (makeRenderPassWithoutAttachments	(vk, device));
	const Unique<VkFramebuffer>		framebuffer	  (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout				(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool		  (makeCommandPool					(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer	  (allocateCommandBuffer			(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build(vk, device, *pipelineLayout, *renderPass));

	// Data that will be verified across all cases
	std::vector<float> additionalSegmentLengths;
	std::vector<int>   additionalSegmentLocations;

	bool success = false;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc			  = tessLevelsBuffer.getAllocation();
			float* const	  tessLevelOuter1 = static_cast<float*>(alloc.getHostPtr());

			*tessLevelOuter1 = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), tessLevelsBufferSizeBytes);
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);

		// Begin render pass
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify the result.
		{
			tcu::TestLog& log = context.getTestContext().getLog();

			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32 numResults = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<float> resultTessCoords = readFloatArray(numResults, resultAlloc.getHostPtr(), sizeof(deInt32));

			// Outputs
			float additionalSegmentLength;
			int   additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, spacingMode, tessLevelCases[tessLevelCaseNdx], resultTessCoords,
													&additionalSegmentLength, &additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	} // for tessLevelCaseNdx

	if (success)
		success = verifyFractionalSpacingMultiple(context.getTestContext().getLog(), spacingMode, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	return (success ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Failure"));
}